

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::AutotuneStrategy::updateBest(AutotuneStrategy *this,Args *args)

{
  size_t sVar1;
  int iVar2;
  Args *in_RSI;
  Args *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  vector<int,_std::allocator<int>_> *in_stack_00000020;
  int in_stack_0000002c;
  AutotuneStrategy *in_stack_00000030;
  
  Args::operator=(in_RSI,in_RDI);
  iVar2 = getIndex(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  *(int *)((long)&in_RDI[1].manualArgs_._M_h._M_before_begin._M_nxt + 4) = iVar2;
  sVar1 = in_RSI->dsub;
  auVar4._8_4_ = (int)(sVar1 >> 0x20);
  auVar4._0_8_ = sVar1;
  auVar4._12_4_ = 0x45300000;
  dVar3 = log2((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  *(int *)&in_RDI[1].manualArgs_._M_h._M_element_count = (int)dVar3;
  if (in_RSI->bucket != 0) {
    *(int *)((long)&in_RDI[1].manualArgs_._M_h._M_element_count + 4) = in_RSI->bucket;
  }
  return;
}

Assistant:

void AutotuneStrategy::updateBest(const Args& args) {
  bestArgs_ = args;
  bestMinnIndex_ = getIndex(args.minn, minnChoices_);
  bestDsubExponent_ = log2(args.dsub);
  if (args.bucket != 0) {
    bestNonzeroBucket_ = args.bucket;
  }
}